

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest3::getTessellationEvaluationShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest3 *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(quads) in;\n\nsubroutine void testSubroutineType(inout vec4 test);\n\nvoid testSubroutine1(inout vec4 test)\n{\n    test += vec4(2, 3, 4, 5);\n}\n\nuniform testSubroutineType subroutineFunction;\n\nvoid main()\n{\n    vec4 test = vec4(1, 2, 3, 4);\n\n    subroutineFunction(test);\n\n    gl_Position = test;\n}\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest3::getTessellationEvaluationShaderBody() const
{
	return "#version 400\n"
		   "\n"
		   "#extension GL_ARB_shader_subroutine : require\n"
		   "\n"
		   "layout(quads) in;\n"
		   "\n"
		   "subroutine void testSubroutineType(inout vec4 test);\n"
		   "\n"
		   "void testSubroutine1(inout vec4 test)\n"
		   "{\n"
		   "    test += vec4(2, 3, 4, 5);\n"
		   "}\n"
		   "\n"
		   "uniform testSubroutineType subroutineFunction;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    vec4 test = vec4(1, 2, 3, 4);\n"
		   "\n"
		   "    subroutineFunction(test);\n"
		   "\n"
		   "    gl_Position = test;\n"
		   "}\n";
}